

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_base.c
# Opt level: O0

MPP_RET set_code_frame(void *hal)

{
  HalVp8eCtx *ctx;
  void *hal_local;
  
  vp8e_init_entropy(hal);
  set_segmentation(hal);
  set_filter(hal);
  set_frame_header(hal);
  set_new_frame(hal);
  vp8e_write_entropy_tables(hal);
  return MPP_OK;
}

Assistant:

static MPP_RET set_code_frame(void *hal)
{
    HalVp8eCtx *ctx = (HalVp8eCtx *) hal;

    vp8e_init_entropy(ctx);
    set_segmentation(ctx);
    set_filter(ctx);
    set_frame_header(ctx);
    set_new_frame(ctx);
    vp8e_write_entropy_tables(ctx);

    return MPP_OK;
}